

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QPointF *p)

{
  long lVar1;
  _func_int **pp_Var2;
  QDebug *pQVar3;
  double *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)p);
  *(undefined1 *)((long)p->xp + 0x30) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)p,"QPointF");
  QDebug::operator<<(pQVar3,'(');
  pQVar3 = QDebug::operator<<((QDebug *)p,*in_RDX);
  pQVar3 = QDebug::operator<<(pQVar3,',');
  QDebug::operator<<(pQVar3,in_RDX[1]);
  QDebug::operator<<((QDebug *)p,')');
  pp_Var2 = (_func_int **)p->xp;
  p->xp = 0.0;
  ((dbg.stream)->ts)._vptr_QTextStream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QPointF &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QPointF" << '(';
    QtDebugUtils::formatQPoint(dbg, p);
    dbg << ')';
    return dbg;
}